

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemorySSA.cpp
# Opt level: O2

void __thiscall
dg::dda::MemorySSATransformation::addDefinitionsFromCalledValue
          (MemorySSATransformation *this,RWNode *phi,RWNodeCall *C,DefSite *ds,RWNode *calledValue)

{
  vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> defs;
  set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_> defSet;
  Definitions D;
  
  defs.super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  D.definitions._definitions._M_h._M_buckets = &D.definitions._definitions._M_h._M_single_bucket;
  D._processed = false;
  D.definitions._definitions._M_h._M_bucket_count = 1;
  D.definitions._definitions._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  D.definitions._definitions._M_h._M_element_count = 0;
  D.definitions._definitions._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  D.definitions._definitions._M_h._M_rehash_policy._4_4_ = 0;
  D.definitions._definitions._M_h._M_rehash_policy._M_next_resize = 0;
  D.definitions._definitions._M_h._M_single_bucket = (__node_base_ptr)0x0;
  defs.super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  defs.super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  D.kills._definitions._M_h._M_buckets = &D.kills._definitions._M_h._M_single_bucket;
  D.kills._definitions._M_h._M_bucket_count = 1;
  D.kills._definitions._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  D.kills._definitions._M_h._M_element_count = 0;
  D.kills._definitions._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  D.kills._definitions._M_h._M_rehash_policy._4_4_ = 0;
  D.kills._definitions._M_h._M_rehash_policy._M_next_resize = 0;
  D.kills._definitions._M_h._M_single_bucket = (__node_base_ptr)0x0;
  D.unknownWrites.super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  D.unknownWrites.super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  D.unknownWrites.super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Definitions::update(&D,calledValue,(RWNode *)0x0);
  Definitions::get((set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
                    *)&defSet._M_t,&D,ds);
  std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>::
  insert<std::_Rb_tree_const_iterator<dg::dda::RWNode*>,void>
            ((vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>> *)&defs,(const_iterator)0x0,
             (_Rb_tree_const_iterator<dg::dda::RWNode_*>)
             defSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<dg::dda::RWNode_*>)&defSet._M_t._M_impl.super__Rb_tree_header)
  ;
  addUncoveredFromPredecessors(this,(C->super_RWNode).bblock,&D,ds,&defs);
  RWNode::DefUses::add<std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>>
            (&phi->defuse,&defs);
  std::
  _Rb_tree<dg::dda::RWNode_*,_dg::dda::RWNode_*,_std::_Identity<dg::dda::RWNode_*>,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
  ::~_Rb_tree(&defSet._M_t);
  Definitions::~Definitions(&D);
  std::_Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::~_Vector_base
            ((_Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)&defs);
  return;
}

Assistant:

void MemorySSATransformation::addDefinitionsFromCalledValue(
        RWNode *phi, RWNodeCall *C, const DefSite &ds, RWNode *calledValue) {
    std::vector<RWNode *> defs;
    Definitions D;
    // FIXME: cache this somehow ?
    D.update(calledValue);

    auto defSet = D.get(ds);
    assert((!defSet.empty() || D.unknownWrites.empty()) &&
           "BUG: if we found no definitions, also unknown writes must be "
           "empty");
    defs.insert(defs.end(), defSet.begin(), defSet.end());
    addUncoveredFromPredecessors(C->getBBlock(), D, ds, defs);
    phi->addDefUse(defs);
}